

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O1

BitState __thiscall I2sSimulationDataGenerator::GetNextAudioBit(I2sSimulationDataGenerator *this)

{
  PcmBitAlignment PVar1;
  uint uVar2;
  ulong uVar3;
  S64 SVar4;
  
LAB_00108efd:
  switch(this->mBitGenerationState) {
  case Init:
    goto switchD_00108f14_caseD_0;
  case LeftPadding:
    if (this->mSettings->mWordAlignment != RIGHT_ALIGNED) {
      this->mBitGenerationState = Data;
      goto LAB_00108efd;
    }
    break;
  case Data:
    uVar2 = this->mCurrentBitIndex;
    if (uVar2 != this->mSettings->mBitsPerWord) {
      uVar3 = (this->mBitMasks).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar2];
      this->mCurrentBitIndex = uVar2 + 1;
      return (uint)((this->mCurrentWord & uVar3) != 0);
    }
    this->mCurrentBitIndex = 0;
    SVar4 = GetNextAudioWord(this);
    this->mCurrentWord = SVar4;
    this->mBitGenerationState = RightPadding;
    goto LAB_00108efd;
  case RightPadding:
    if (this->mSettings->mWordAlignment != LEFT_ALIGNED) {
      this->mBitGenerationState = LeftPadding;
      goto LAB_00108efd;
    }
    break;
  default:
    AnalyzerHelpers::Assert("unexpected");
    return BIT_LOW;
  }
  if (this->mPaddingCount < this->mNumPaddingBits) {
    this->mPaddingCount = this->mPaddingCount + 1;
    return BIT_LOW;
  }
  this->mPaddingCount = 0;
  this->mBitGenerationState = Data;
  goto LAB_00108efd;
switchD_00108f14_caseD_0:
  PVar1 = this->mSettings->mBitAlignment;
  this->mBitGenerationState = LeftPadding;
  if (PVar1 == BITS_SHIFTED_RIGHT_1) {
    return BIT_LOW;
  }
  goto LAB_00108efd;
}

Assistant:

BitState I2sSimulationDataGenerator::GetNextAudioBit()
{
    switch( mBitGenerationState )
    {
    case Init:
        if( mSettings->mBitAlignment == BITS_SHIFTED_RIGHT_1 )
        {
            mBitGenerationState = LeftPadding;
            return BIT_LOW; // just once, we'll insert a 1-bit offset.
        }
        else
        {
            mBitGenerationState = LeftPadding;
            return GetNextAudioBit();
        }
        break;
    case LeftPadding:
        if( mSettings->mWordAlignment == RIGHT_ALIGNED )
        {
            if( mPaddingCount < mNumPaddingBits )
            {
                mPaddingCount++;
                return BIT_LOW;
            }
            else
            {
                mBitGenerationState = Data;
                mPaddingCount = 0;
                return GetNextAudioBit();
            }
        }
        else
        {
            mBitGenerationState = Data;
            return GetNextAudioBit();
        }
        break;
    case Data:
        if( mCurrentBitIndex == mSettings->mBitsPerWord )
        {
            mCurrentBitIndex = 0;
            mCurrentWord = GetNextAudioWord();
            mBitGenerationState = RightPadding;
            return GetNextAudioBit();
        }
        else
        {
            BitState bit_state;

            if( ( mCurrentWord & mBitMasks[ mCurrentBitIndex ] ) == 0 )
                bit_state = BIT_LOW;
            else
                bit_state = BIT_HIGH;

            mCurrentBitIndex++;
            return bit_state;
        }
        break;
    case RightPadding:
        if( mSettings->mWordAlignment == LEFT_ALIGNED )
        {
            if( mPaddingCount < mNumPaddingBits )
            {
                mPaddingCount++;
                return BIT_LOW;
            }
            else
            {
                mBitGenerationState = Data;
                mPaddingCount = 0;
                return GetNextAudioBit();
            }
        }
        else
        {
            mBitGenerationState = LeftPadding;
            return GetNextAudioBit();
        }
        break;
    default:
        AnalyzerHelpers::Assert( "unexpected" );
        return BIT_LOW; // eliminate warning
        break;
    }
}